

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O1

void __thiscall cfd::core::ScriptElement::ScriptElement(ScriptElement *this,ScriptElement *element)

{
  pointer pcVar1;
  
  this->_vptr_ScriptElement = (_func_int **)&PTR__ScriptElement_00740660;
  this->type_ = element->type_;
  (this->op_code_)._vptr_ScriptOperator = (_func_int **)&PTR__ScriptOperator_00734d50;
  (this->op_code_).data_type_ = (element->op_code_).data_type_;
  (this->op_code_).text_data_._M_dataplus._M_p = (pointer)&(this->op_code_).text_data_.field_2;
  pcVar1 = (element->op_code_).text_data_._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->op_code_).text_data_,pcVar1,
             pcVar1 + (element->op_code_).text_data_._M_string_length);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->binary_data_,
             &(element->binary_data_).data_);
  this->value_ = element->value_;
  return;
}

Assistant:

ScriptElement::ScriptElement(const ScriptElement& element)
    : type_(element.type_),
      op_code_(element.op_code_),
      binary_data_(element.binary_data_),
      value_(element.value_) {
  // do nothing
}